

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::boolargno::test_method(boolargno *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  check_type cVar6;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 local_350 [16];
  undefined1 *local_340;
  char **local_338;
  allocator<char> local_329;
  assertion_result local_328;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  pair<const_char_*,_ArgsManager::Flags> local_2f0;
  pair<const_char_*,_ArgsManager::Flags> local_2e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  local_2e0.first = "-foo";
  local_2f0.second = ALLOW_ANY;
  local_2f0.first = "-bar";
  local_2e0.second = local_2f0.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2d0,&local_2e0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2a8,&local_2f0);
  __l._M_len = 2;
  __l._M_array = &local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_350,__l,(allocator_type *)&local_328);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_350);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_350);
  lVar3 = 0x28;
  do {
    std::__cxx11::string::~string((string *)((long)&local_2d0.first._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"-nofoo",(allocator<char> *)local_350);
  ResetArgs(&local_args,&local_2d0.first);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x197;
  file.m_begin = (iterator)&local_300;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_310,msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2d0.first,true);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_368 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_370,0x197);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x198;
  file_00.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_390,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2d0.first,false);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_398 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_3a0,0x198);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"-nofoo=1",(allocator<char> *)local_350);
  ResetArgs(&local_args,&local_2d0.first);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x19b;
  file_01.m_begin = (iterator)&local_3b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c0,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2d0.first,true);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3c8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_3d0,0x19b);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x19c;
  file_02.m_begin = (iterator)&local_3e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f0,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2d0.first,false);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3f8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_400,0x19c);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"-nofoo=0",(allocator<char> *)local_350);
  ResetArgs(&local_args,&local_2d0.first);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x19f;
  file_03.m_begin = (iterator)&local_410;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_420,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2d0.first,true);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "local_args.GetBoolArg(\"-foo\", true)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_428 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_430,0x19f);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x1a0;
  file_04.m_begin = (iterator)&local_440;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_450,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2d0.first,false);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "local_args.GetBoolArg(\"-foo\", false)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_458 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_460,0x1a0);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"-foo --nofoo",(allocator<char> *)local_350);
  ResetArgs(&local_args,&local_2d0.first);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x1a3;
  file_05.m_begin = (iterator)&local_470;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_480,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2d0.first,true);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_488 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_490,0x1a3);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x1a4;
  file_06.m_begin = (iterator)&local_4a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4b0,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2d0.first,false);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4b8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_4c0,0x1a4);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"-nofoo -foo",(allocator<char> *)local_350);
  ResetArgs(&local_args,&local_2d0.first);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x1a7;
  file_07.m_begin = (iterator)&local_4d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4e0,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2d0.first,true);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "local_args.GetBoolArg(\"-foo\", true)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4e8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,_cVar6,(size_t)&local_4f0,0x1a7);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  file_08.m_end = (iterator)0x1a8;
  file_08.m_begin = (iterator)&local_500;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_510,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"-foo",&local_329);
  local_328.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2d0.first,false);
  local_328.m_message.px = (element_type *)0x0;
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_360 = "local_args.GetBoolArg(\"-foo\", false)";
  local_358 = "";
  local_350[8] = false;
  local_350._0_8_ = &PTR__lazy_ostream_0113a070;
  local_340 = boost::unit_test::lazy_ostream::inst;
  local_338 = &local_360;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_350,1,0,WARN,0xb92570,(size_t)&stack0xfffffffffffffae0
             ,0x1a8);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2d0);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(boolargno)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "-nofoo");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo=0");
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-foo --nofoo"); // --nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo -foo"); // foo always wins:
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
}